

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CDirectiveFile.cpp
# Opt level: O1

void __thiscall CDirectiveAlignFill::writeSymData(CDirectiveAlignFill *this,SymbolData *symData)

{
  if (*(int *)&(this->super_CAssemblerCommand).field_0x14 == 2) {
    SymbolData::addData(symData,this->virtualAddress,this->value,Data8);
    return;
  }
  return;
}

Assistant:

void CDirectiveAlignFill::writeSymData(SymbolData& symData) const
{
	switch (mode)
	{
	case AlignVirtual:	// ?
	case AlignPhysical:	// ?
		break;
	case Fill:
		symData.addData(virtualAddress,value,SymbolData::Data8);
		break;
	}
}